

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O0

void tcg_gen_bswap16_i64_riscv32(TCGContext_conflict9 *tcg_ctx,TCGv_i64 ret,TCGv_i64 arg)

{
  TCGv_i64 arg_local;
  TCGv_i64 ret_local;
  TCGContext_conflict9 *tcg_ctx_local;
  
  tcg_gen_op2_i64(tcg_ctx,INDEX_op_bswap16_i64,ret,arg);
  return;
}

Assistant:

void tcg_gen_bswap16_i64(TCGContext *tcg_ctx, TCGv_i64 ret, TCGv_i64 arg)
{
#if TCG_TARGET_REG_BITS == 32
        tcg_gen_bswap16_i32(tcg_ctx, TCGV_LOW(tcg_ctx, ret), TCGV_LOW(tcg_ctx, arg));
        tcg_gen_movi_i32(tcg_ctx, TCGV_HIGH(tcg_ctx, ret), 0);
#elif TCG_TARGET_HAS_bswap16_i64
        tcg_gen_op2_i64(tcg_ctx, INDEX_op_bswap16_i64, ret, arg);
#else
        TCGv_i64 t0 = tcg_temp_new_i64(tcg_ctx);

        tcg_gen_ext8u_i64(tcg_ctx, t0, arg);
        tcg_gen_shli_i64(tcg_ctx, t0, t0, 8);
        tcg_gen_shri_i64(tcg_ctx, ret, arg, 8);
        tcg_gen_or_i64(tcg_ctx, ret, ret, t0);
        tcg_temp_free_i64(tcg_ctx, t0);
#endif
}